

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O1

ROMInfo ** MT32Emu::ROMInfo::getROMInfoList(Bit32u types,Bit32u pairTypes)

{
  ROMInfo *pRVar1;
  ROMInfo **ppRVar2;
  ROMInfo **ppRVar3;
  long lVar4;
  long lVar5;
  undefined **ppuVar6;
  undefined8 *puVar7;
  byte bVar8;
  
  bVar8 = 0;
  if (getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ == 0) {
    getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_04_B;
    getROMInfoLists()::CTRL_MT32_V1_05_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_05_B;
    getROMInfoLists()::CTRL_MT32_V1_06_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_06_B;
    getROMInfoLists()::CTRL_MT32_V1_07_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_07_B;
    getROMInfoLists()::CTRL_MT32_BLUER_A._48_8_ = getROMInfoLists()::CTRL_MT32_BLUER_B;
    getROMInfoLists()::PCM_MT32_L._48_8_ = getROMInfoLists()::PCM_MT32_H;
    getROMInfoLists()::PCM_CM32L_L._48_8_ = getROMInfoLists()::PCM_CM32L_H;
    ppuVar6 = &getROMInfoLists()::FULL_ROM_INFOS;
    puVar7 = &getROMInfoLists()::ALL_ROM_INFOS;
    for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar7 = *ppuVar6;
      ppuVar6 = ppuVar6 + 1;
      puVar7 = puVar7 + 1;
    }
    ppuVar6 = &getROMInfoLists()::PARTIAL_ROM_INFOS;
    puVar7 = &DAT_001d14f0;
    for (lVar4 = 0xf; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar7 = *ppuVar6;
      ppuVar6 = ppuVar6 + 1;
      puVar7 = puVar7 + 1;
    }
  }
  ppRVar2 = (ROMInfo **)operator_new__(0xe8);
  lVar4 = 0;
  ppRVar3 = ppRVar2;
  do {
    if (getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ == 0) {
      getROMInfoLists()::CTRL_MT32_V1_04_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_04_B;
      getROMInfoLists()::CTRL_MT32_V1_05_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_05_B;
      getROMInfoLists()::CTRL_MT32_V1_06_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_06_B;
      getROMInfoLists()::CTRL_MT32_V1_07_A._48_8_ = getROMInfoLists()::CTRL_MT32_V1_07_B;
      getROMInfoLists()::CTRL_MT32_BLUER_A._48_8_ = getROMInfoLists()::CTRL_MT32_BLUER_B;
      getROMInfoLists()::PCM_MT32_L._48_8_ = getROMInfoLists()::PCM_MT32_H;
      getROMInfoLists()::PCM_CM32L_L._48_8_ = getROMInfoLists()::PCM_CM32L_H;
      ppuVar6 = &getROMInfoLists()::FULL_ROM_INFOS;
      puVar7 = &getROMInfoLists()::ALL_ROM_INFOS;
      for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar7 = *ppuVar6;
        ppuVar6 = ppuVar6 + (ulong)bVar8 * -2 + 1;
        puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
      }
      ppuVar6 = &getROMInfoLists()::PARTIAL_ROM_INFOS;
      puVar7 = &DAT_001d14f0;
      for (lVar5 = 0xf; lVar5 != 0; lVar5 = lVar5 + -1) {
        *puVar7 = *ppuVar6;
        ppuVar6 = ppuVar6 + (ulong)bVar8 * -2 + 1;
        puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
      }
    }
    pRVar1 = *(ROMInfo **)((long)&getROMInfoLists()::ALL_ROM_INFOS + lVar4);
    if (((types >> (pRVar1->type & 0x1f) & 1) != 0) &&
       ((pairTypes >> (pRVar1->pairType & 0x1f) & 1) != 0)) {
      *ppRVar3 = pRVar1;
      ppRVar3 = ppRVar3 + 1;
    }
    lVar4 = lVar4 + 8;
  } while (lVar4 != 0xe0);
  *ppRVar3 = (ROMInfo *)0x0;
  return ppRVar2;
}

Assistant:

const ROMInfo **ROMInfo::getROMInfoList(Bit32u types, Bit32u pairTypes) {
	Bit32u romCount = getROMInfoLists().allROMInfos.itemCount; // Excludes the NULL terminator.
	const ROMInfo **romInfoList = new const ROMInfo*[romCount + 1];
	const ROMInfo **currentROMInList = romInfoList;
	for (Bit32u i = 0; i < romCount; i++) {
		const ROMInfo *romInfo = getKnownROMInfoFromList(i);
		if ((types & (1 << romInfo->type)) && (pairTypes & (1 << romInfo->pairType))) {
			*currentROMInList++ = romInfo;
		}
	}
	*currentROMInList = NULL;
	return romInfoList;
}